

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_queue.cpp
# Opt level: O2

RK_S32 __thiscall MppQueue::pull(MppQueue *this,void *data,RK_S32 size)

{
  RK_S32 RVar1;
  AutoMutex autoLock;
  
  if (this->mFlushFlag == 0) {
    sem_wait((sem_t *)&this->mQueuePending);
  }
  autoLock.mEnabled = 1;
  autoLock.mLock = (Mutex *)this;
  pthread_mutex_lock((pthread_mutex_t *)this);
  RVar1 = mpp_list::list_size(&this->super_mpp_list);
  if (RVar1 == 0) {
    RVar1 = -1;
  }
  else {
    RVar1 = mpp_list::del_at_head(&this->super_mpp_list,data,size);
  }
  Mutex::Autolock::~Autolock(&autoLock);
  return RVar1;
}

Assistant:

RK_S32 MppQueue::pull(void *data, RK_S32 size)
{
    if (!mFlushFlag)
        sem_wait(&mQueuePending);
    {
        AutoMutex autoLock(mpp_list::mutex());
        if (!mpp_list::list_size())
            return MPP_NOK;

        return mpp_list::del_at_head(data, size);
    }
    return MPP_ERR_INIT;
}